

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O2

string * FindPTypes_abi_cxx11_(string *__return_storage_ptr__,aiScene *scene)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  byte bVar3;
  undefined4 uVar4;
  char *pcVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  char *__rhs;
  byte bVar9;
  undefined1 auVar10 [16];
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = 0;
  bVar8 = 0;
  bVar7 = 0;
  bVar9 = 0;
  for (uVar2 = 0; scene->mNumMeshes != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = scene->mMeshes[uVar2]->mPrimitiveTypes;
    auVar10._0_4_ = -(uint)((uVar1 & 8) == 8);
    auVar10._4_4_ = -(uint)((uVar1 & 4) == 4);
    auVar10._8_4_ = -(uint)((uVar1 & 2) == 2);
    auVar10._12_4_ = -(uint)((uVar1 & 1) == 1);
    uVar4 = movmskps((int)scene->mMeshes[uVar2],auVar10);
    bVar3 = (byte)uVar4;
    bVar7 = bVar7 | bVar3;
    bVar9 = bVar9 | bVar3 >> 3;
    bVar6 = bVar6 | (bVar3 & 4) >> 2;
    bVar8 = bVar8 | (bVar3 & 2) >> 1;
  }
  if ((bVar9 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"points",&local_91);
  }
  pcVar5 = "lines";
  __rhs = "";
  if (bVar6 == 0) {
    pcVar5 = "";
  }
  std::operator+(&local_70,&local_90,pcVar5);
  pcVar5 = "triangles";
  if (bVar8 == 0) {
    pcVar5 = "";
  }
  std::operator+(&local_50,&local_70,pcVar5);
  if ((bVar7 & 1) != 0) {
    __rhs = "n-polygons";
  }
  std::operator+(__return_storage_ptr__,&local_50,__rhs);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string FindPTypes(const aiScene* scene)
{
	bool haveit[4] = {0};
	for(unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const unsigned int pt = scene->mMeshes[i]->mPrimitiveTypes;
		if (pt & aiPrimitiveType_POINT) {
			haveit[0]=true;
		}
		if (pt & aiPrimitiveType_LINE) {
			haveit[1]=true;
		}
		if (pt & aiPrimitiveType_TRIANGLE) {
			haveit[2]=true;
		}
		if (pt & aiPrimitiveType_POLYGON) {
			haveit[3]=true;
		}
	}
	return (haveit[0]?std::string("points"):"")+(haveit[1]?"lines":"")+
		(haveit[2]?"triangles":"")+(haveit[3]?"n-polygons":"");
}